

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O0

void print_time(long micro)

{
  long __y;
  ostream *poVar1;
  __type_conflict1 _Var2;
  int local_24;
  long lStack_20;
  int i;
  long p;
  long n;
  long micro_local;
  
  _Var2 = std::log10<long>(micro);
  __y = (long)_Var2;
  _Var2 = std::pow<int,long>(10,__y);
  lStack_20 = (long)_Var2;
  n = micro;
  for (local_24 = 0; local_24 < __y; local_24 = local_24 + 1) {
    std::ostream::operator<<((ostream *)&std::cout,n / lStack_20);
    n = n % lStack_20;
    lStack_20 = lStack_20 / 10;
    if ((__y - local_24) % 3 == 0) {
      std::operator<<((ostream *)&std::cout,"\'");
    }
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,n);
  std::operator<<(poVar1,anon_var_dwarf_1f8af);
  return;
}

Assistant:

void print_time(long micro) {
    long n = (long) log10(micro);
    long p = pow(10, n);
    for (int i = 0; i < n; ++i) {
        cout << micro / p;
        micro %= p;
        p /= 10;
        if ((n - i) % 3 == 0) cout << "'";
    }
    cout << micro << "\u00B5s";
}